

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_zhao_2010.h
# Opt level: O0

void __thiscall SBLA::FindRootAndCompressMem(SBLA *this,MemMat<int> *img_labels,int pos,int newroot)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int tmppos;
  int newroot_local;
  int pos_local;
  MemMat<int> *img_labels_local;
  SBLA *this_local;
  
  tmppos = pos;
  do {
    piVar2 = MemMat<int>::operator()(img_labels,-tmppos);
    iVar1 = *piVar2;
    if (iVar1 == newroot) {
      return;
    }
    piVar2 = MemMat<int>::operator()(img_labels,-tmppos);
    *piVar2 = newroot;
    bVar3 = iVar1 != tmppos;
    tmppos = iVar1;
  } while (bVar3);
  return;
}

Assistant:

inline void FindRootAndCompressMem(MemMat<int>& img_labels, int pos, int newroot)
    {
        while (true) {
            int tmppos = img_labels(-pos);
            if (tmppos == newroot)
                break;
            img_labels(-pos) = newroot;
            if (tmppos == pos)
                break;
            pos = tmppos;
        }
    }